

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O1

void __thiscall w3Module::read_functions(w3Module *this,uint8_t **cursor)

{
  pointer pwVar1;
  uint32_t uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  printf("reading section 3 offset:%lX\n",(long)*cursor - (long)this->base);
  lVar3 = (long)(this->functions).super__Vector_base<w3Function,_std::allocator<w3Function>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->functions).super__Vector_base<w3Function,_std::allocator<w3Function>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3;
  lVar4 = lVar3 * -0x3333333333333333;
  if (lVar4 - this->import_function_count != 0) {
    AssertFailed("old == import_function_count");
  }
  uVar2 = ::read_varuint32(cursor,this->end);
  uVar6 = (ulong)uVar2;
  std::vector<w3Function,_std::allocator<w3Function>_>::resize(&this->functions,uVar6 + lVar4);
  if (uVar2 != 0) {
    lVar3 = lVar3 * 8;
    uVar5 = 0;
    do {
      printf("read_function %lX:%lX\n",uVar5,uVar6);
      pwVar1 = (this->functions).super__Vector_base<w3Function,_std::allocator<w3Function>_>._M_impl
               .super__Vector_impl_data._M_start;
      uVar2 = ::read_varuint32(cursor,this->end);
      *(ulong *)((long)&pwVar1->function_type_index + lVar3) = (ulong)uVar2;
      *(ulong *)((long)&pwVar1->function_index + lVar3) = lVar4 + uVar5;
      (&pwVar1->import)[lVar3] = false;
      uVar5 = uVar5 + 1;
      lVar3 = lVar3 + 0x28;
    } while (uVar6 != uVar5);
  }
  puts("read section 3");
  return;
}

Assistant:

void w3Module::read_functions (uint8_t** cursor)
{
    printf ("reading section 3 offset:%" FORMAT_SIZE "X\n", (long_t)(*cursor - this->base));
    const size_t old = functions.size ();
    Assert (old == import_function_count);
    const size_t size = read_varuint32 (cursor);
    functions.resize (old + size);
    for (size_t i = 0; i < size; ++i)
    {
        printf ("read_function %" FORMAT_SIZE "X:%" FORMAT_SIZE "X\n", i, size);
        w3Function& a = functions [old + i];
        a.function_type_index = read_varuint32 (cursor);
        a.function_index = i + old; // TODO probably not needed
        a.import = false; // TODO probably not needed
    }
    printf ("read section 3\n");
}